

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O2

Gia_Man_t * Bmc_CexTargetEnlarge(Gia_Man_t *p,int nFrames)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar8 = 0;
  iVar3 = 0;
  if (0 < nFrames) {
    iVar3 = nFrames;
  }
  for (; iVar8 != iVar3; iVar8 = iVar8 + 1) {
    iVar9 = 0;
    while ((iVar9 < p->vCis->nSize - p->nRegs &&
           (pGVar5 = Gia_ManCi(p,iVar9), pGVar5 != (Gia_Obj_t *)0x0))) {
      Gia_ManAppendCi(p_00);
      iVar9 = iVar9 + 1;
    }
  }
  iVar8 = 0;
  while ((iVar8 < p->nRegs &&
         (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8), pGVar5 != (Gia_Obj_t *)0x0))) {
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
    iVar8 = iVar8 + 1;
  }
  iVar9 = nFrames + -1;
  iVar8 = 0;
  do {
    if (iVar8 == iVar3) {
      pGVar5 = Gia_ManPo(p,0);
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      uVar1 = Gia_ManAppendCo(p_00,iVar3);
      pGVar5->Value = uVar1;
      Gia_ManHashStop(p_00);
      pGVar7 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar7;
    }
    iVar10 = 0;
    while ((iVar10 < p->vCis->nSize - p->nRegs &&
           (pGVar5 = Gia_ManCi(p,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
      pGVar6 = Gia_ManCi(p_00,(p->vCis->nSize - p->nRegs) * iVar9 + iVar10);
      iVar2 = Gia_ObjId(p_00,(Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe));
      if (iVar2 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf1,"int Abc_Var2Lit(int, int)");
      }
      pGVar5->Value = ((uint)pGVar6 & 1) + iVar2 * 2;
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    while ((iVar10 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar10), pGVar5 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
        iVar2 = Gia_ObjFanin0Copy(pGVar5);
        uVar1 = (uint)((ulong)*(undefined8 *)pGVar5 >> 0x20);
        iLit1 = Abc_LitNotCond(pGVar5[-(ulong)(uVar1 & 0x1fffffff)].Value,uVar1 >> 0x1d & 1);
        uVar1 = Gia_ManHashAnd(p_00,iVar2,iLit1);
        pGVar5->Value = uVar1;
      }
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    while ((iVar10 < p->nRegs &&
           (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10), pGVar5 != (Gia_Obj_t *)0x0))
          ) {
      uVar1 = Gia_ObjFanin0Copy(pGVar5);
      pGVar5->Value = uVar1;
      iVar10 = iVar10 + 1;
    }
    iVar10 = 0;
    while (((iVar10 < p->nRegs &&
            (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar10), pGVar5 != (Gia_Obj_t *)0x0)
            ) && (pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar10),
                 pGVar6 != (Gia_Obj_t *)0x0))) {
      pGVar6->Value = pGVar5->Value;
      iVar10 = iVar10 + 1;
    }
    iVar8 = iVar8 + 1;
    iVar9 = iVar9 + -1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_CexTargetEnlarge( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( k = 0; k < nFrames; k++ )
        Gia_ManForEachPi( p, pObj, i )
            Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( k = 0; k < nFrames; k++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, (nFrames - 1 - k) * Gia_ManPiNum(p) + i );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value  = pObj->Value;
    }
    pObj = Gia_ManPo( p, 0 );
    pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}